

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_acl_text.c
# Opt level: O0

wchar_t * convert_s_to_ws(char *s)

{
  size_t sVar1;
  wchar_t *local_20;
  wchar_t *ws;
  size_t len;
  char *s_local;
  
  local_20 = (wchar_t *)0x0;
  if (s != (char *)0x0) {
    sVar1 = strlen(s);
    local_20 = (wchar_t *)malloc((sVar1 + 1) * 4);
    sVar1 = mbstowcs(local_20,s,sVar1 + 1);
    assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_acl_text.c"
                     ,L'ò',(uint)(sVar1 != 0xffffffffffffffff),"mbstowcs(ws, s, len) != (size_t)-1"
                     ,(void *)0x0);
  }
  return local_20;
}

Assistant:

static wchar_t *
convert_s_to_ws(const char *s)
{
	size_t len;
	wchar_t *ws = NULL;

	if (s != NULL) {
		len = strlen(s) + 1;
		ws = malloc(len * sizeof(wchar_t));
		assert(mbstowcs(ws, s, len) != (size_t)-1);
	}

	return (ws);
}